

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  Ref<embree::Geometry> *pRVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined4 uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  Geometry *pGVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 (*pauVar41) [16];
  undefined1 (*pauVar42) [16];
  long lVar43;
  ulong unaff_R13;
  size_t mask;
  int iVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  float fVar47;
  float fVar52;
  float fVar53;
  vint4 bi;
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float fVar54;
  undefined1 auVar51 [32];
  uint uVar55;
  vint4 ai;
  undefined1 auVar56 [16];
  uint uVar60;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  float fVar72;
  float fVar75;
  float fVar76;
  undefined1 auVar73 [16];
  float fVar77;
  undefined1 auVar74 [32];
  vint4 bi_1;
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong local_1378;
  ulong local_1370;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined1 local_1260 [32];
  undefined1 local_1240 [8];
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  float local_1200;
  float fStack_11fc;
  float fStack_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  undefined4 uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  float local_fe0 [4];
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  undefined4 uStack_fc4;
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar42 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar72 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar68._4_4_ = fVar72;
  auVar68._0_4_ = fVar72;
  auVar68._8_4_ = fVar72;
  auVar68._12_4_ = fVar72;
  fVar75 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar70._4_4_ = fVar75;
  auVar70._0_4_ = fVar75;
  auVar70._8_4_ = fVar75;
  auVar70._12_4_ = fVar75;
  fVar76 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar73._4_4_ = fVar76;
  auVar73._0_4_ = fVar76;
  auVar73._8_4_ = fVar76;
  auVar73._12_4_ = fVar76;
  fVar72 = fVar72 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar75 = fVar75 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar76 = fVar76 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar44 = (tray->tfar).field_0.i[k];
  auVar78 = ZEXT1664(CONCAT412(iVar44,CONCAT48(iVar44,CONCAT44(iVar44,iVar44))));
  auVar79._0_8_ = CONCAT44(fVar72,fVar72) ^ 0x8000000080000000;
  auVar79._8_4_ = -fVar72;
  auVar79._12_4_ = -fVar72;
  auVar81._0_8_ = CONCAT44(fVar75,fVar75) ^ 0x8000000080000000;
  auVar81._8_4_ = -fVar75;
  auVar81._12_4_ = -fVar75;
  auVar82._0_8_ = CONCAT44(fVar76,fVar76) ^ 0x8000000080000000;
  auVar82._8_4_ = -fVar76;
  auVar82._12_4_ = -fVar76;
  iVar44 = (tray->tnear).field_0.i[k];
  auVar84._4_4_ = iVar44;
  auVar84._0_4_ = iVar44;
  auVar84._8_4_ = iVar44;
  auVar84._12_4_ = iVar44;
  local_1220._16_16_ = mm_lookupmask_ps._240_16_;
  local_1220._0_16_ = mm_lookupmask_ps._0_16_;
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = &DAT_3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  auVar57._16_4_ = 0x3f800000;
  auVar57._20_4_ = 0x3f800000;
  auVar57._24_4_ = 0x3f800000;
  auVar57._28_4_ = 0x3f800000;
  auVar85._8_4_ = 0xbf800000;
  auVar85._0_8_ = 0xbf800000bf800000;
  auVar85._12_4_ = 0xbf800000;
  auVar85._16_4_ = 0xbf800000;
  auVar85._20_4_ = 0xbf800000;
  auVar85._24_4_ = 0xbf800000;
  auVar85._28_4_ = 0xbf800000;
  _local_1240 = vblendvps_avx(auVar57,auVar85,local_1220);
  do {
    do {
      do {
        if (pauVar42 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar41 = pauVar42 + -1;
        pauVar42 = pauVar42 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar41 + 8));
      uVar31 = *(ulong *)*pauVar42;
      pauVar41 = pauVar42;
      do {
        if ((uVar31 & 8) == 0) {
          auVar45 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar32),auVar79,auVar68);
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar39),auVar81,auVar70);
          auVar45 = vpmaxsd_avx(auVar45,auVar48);
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar40),auVar82,auVar73);
          auVar48 = vpmaxsd_avx(auVar48,auVar84);
          auVar48 = vpmaxsd_avx(auVar45,auVar48);
          auVar45 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar32 ^ 0x10)),auVar79,
                                    auVar68);
          auVar56 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar39 ^ 0x10)),auVar81,
                                    auVar70);
          auVar45 = vpminsd_avx(auVar45,auVar56);
          auVar56 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar40 ^ 0x10)),auVar82,
                                    auVar73);
          auVar56 = vpminsd_avx(auVar56,auVar78._0_16_);
          auVar45 = vpminsd_avx(auVar45,auVar56);
          auVar45 = vpcmpgtd_avx(auVar48,auVar45);
          uVar33 = vmovmskps_avx(auVar45);
          unaff_R13 = (ulong)(byte)((byte)uVar33 ^ 0xf);
          local_1180._0_16_ = auVar48;
        }
        pauVar42 = pauVar41;
        if ((uVar31 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar44 = 4;
          }
          else {
            uVar30 = uVar31 & 0xfffffffffffffff0;
            lVar43 = 0;
            for (uVar31 = unaff_R13; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              lVar43 = lVar43 + 1;
            }
            iVar44 = 0;
            uVar36 = unaff_R13 - 1 & unaff_R13;
            uVar31 = *(ulong *)(uVar30 + lVar43 * 8);
            if (uVar36 != 0) {
              uVar55 = *(uint *)(local_1180 + lVar43 * 4);
              lVar43 = 0;
              for (uVar14 = uVar36; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                lVar43 = lVar43 + 1;
              }
              uVar36 = uVar36 - 1 & uVar36;
              uVar14 = *(ulong *)(uVar30 + lVar43 * 8);
              uVar34 = *(uint *)(local_1180 + lVar43 * 4);
              if (uVar36 == 0) {
                pauVar42 = pauVar41 + 1;
                if (uVar55 < uVar34) {
                  *(ulong *)*pauVar41 = uVar14;
                  *(uint *)(*pauVar41 + 8) = uVar34;
                }
                else {
                  *(ulong *)*pauVar41 = uVar31;
                  *(uint *)(*pauVar41 + 8) = uVar55;
                  uVar31 = uVar14;
                }
              }
              else {
                auVar45._8_8_ = 0;
                auVar45._0_8_ = uVar31;
                auVar45 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar55));
                auVar48._8_8_ = 0;
                auVar48._0_8_ = uVar14;
                auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar34));
                lVar43 = 0;
                for (uVar31 = uVar36; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
                {
                  lVar43 = lVar43 + 1;
                }
                uVar36 = uVar36 - 1 & uVar36;
                auVar56._8_8_ = 0;
                auVar56._0_8_ = *(ulong *)(uVar30 + lVar43 * 8);
                auVar6 = vpunpcklqdq_avx(auVar56,ZEXT416(*(uint *)(local_1180 + lVar43 * 4)));
                auVar56 = vpcmpgtd_avx(auVar48,auVar45);
                if (uVar36 == 0) {
                  auVar61 = vpshufd_avx(auVar56,0xaa);
                  auVar56 = vblendvps_avx(auVar48,auVar45,auVar61);
                  auVar45 = vblendvps_avx(auVar45,auVar48,auVar61);
                  auVar48 = vpcmpgtd_avx(auVar6,auVar56);
                  auVar61 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar6,auVar56,auVar61);
                  auVar56 = vblendvps_avx(auVar56,auVar6,auVar61);
                  auVar6 = vpcmpgtd_avx(auVar56,auVar45);
                  auVar61 = vpshufd_avx(auVar6,0xaa);
                  auVar6 = vblendvps_avx(auVar56,auVar45,auVar61);
                  auVar45 = vblendvps_avx(auVar45,auVar56,auVar61);
                  *pauVar41 = auVar45;
                  pauVar41[1] = auVar6;
                  uVar31 = auVar48._0_8_;
                  pauVar42 = pauVar41 + 2;
                }
                else {
                  lVar43 = 0;
                  for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                    lVar43 = lVar43 + 1;
                  }
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = *(ulong *)(uVar30 + lVar43 * 8);
                  auVar15 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_1180 + lVar43 * 4)));
                  auVar61 = vpshufd_avx(auVar56,0xaa);
                  auVar56 = vblendvps_avx(auVar48,auVar45,auVar61);
                  auVar45 = vblendvps_avx(auVar45,auVar48,auVar61);
                  auVar48 = vpcmpgtd_avx(auVar15,auVar6);
                  auVar61 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar15,auVar6,auVar61);
                  auVar6 = vblendvps_avx(auVar6,auVar15,auVar61);
                  auVar61 = vpcmpgtd_avx(auVar6,auVar45);
                  auVar15 = vpshufd_avx(auVar61,0xaa);
                  auVar61 = vblendvps_avx(auVar6,auVar45,auVar15);
                  auVar45 = vblendvps_avx(auVar45,auVar6,auVar15);
                  auVar6 = vpcmpgtd_avx(auVar48,auVar56);
                  auVar15 = vpshufd_avx(auVar6,0xaa);
                  auVar6 = vblendvps_avx(auVar48,auVar56,auVar15);
                  auVar48 = vblendvps_avx(auVar56,auVar48,auVar15);
                  auVar56 = vpcmpgtd_avx(auVar61,auVar48);
                  auVar15 = vpshufd_avx(auVar56,0xaa);
                  auVar56 = vblendvps_avx(auVar61,auVar48,auVar15);
                  auVar48 = vblendvps_avx(auVar48,auVar61,auVar15);
                  *pauVar41 = auVar45;
                  pauVar41[1] = auVar48;
                  pauVar41[2] = auVar56;
                  uVar31 = auVar6._0_8_;
                  pauVar42 = pauVar41 + 3;
                  iVar44 = 0;
                }
              }
            }
          }
        }
        else {
          iVar44 = 6;
        }
        pauVar41 = pauVar42;
      } while (iVar44 == 0);
    } while (iVar44 != 6);
    uVar30 = (ulong)((uint)uVar31 & 0xf);
    if (uVar30 != 8) {
      uVar33 = *(undefined4 *)(ray + k * 4);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      local_11c0 = *(float *)(ray + k * 4 + 0x40);
      fStack_11bc = local_11c0;
      fStack_11b8 = local_11c0;
      fStack_11b4 = local_11c0;
      fStack_11b0 = local_11c0;
      fStack_11ac = local_11c0;
      fStack_11a8 = local_11c0;
      fStack_11a4 = local_11c0;
      local_11e0 = *(float *)(ray + k * 4 + 0x50);
      fStack_11dc = local_11e0;
      fStack_11d8 = local_11e0;
      fStack_11d4 = local_11e0;
      fStack_11d0 = local_11e0;
      fStack_11cc = local_11e0;
      fStack_11c8 = local_11e0;
      fStack_11c4 = local_11e0;
      uVar31 = uVar31 & 0xfffffffffffffff0;
      local_1200 = *(float *)(ray + k * 4 + 0x60);
      fStack_11fc = local_1200;
      fStack_11f8 = local_1200;
      fStack_11f4 = local_1200;
      fStack_11f0 = local_1200;
      fStack_11ec = local_1200;
      fStack_11e8 = local_1200;
      fStack_11e4 = local_1200;
      lVar43 = 0;
      do {
        lVar37 = lVar43 * 0xe0;
        lVar1 = uVar31 + 0xd0 + lVar37;
        local_11a0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1198 = *(undefined8 *)(lVar1 + 0x18);
        lVar1 = uVar31 + 0xc0 + lVar37;
        local_1280 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1278 = *(undefined8 *)(lVar1 + 0x18);
        uStack_1270 = local_1280;
        uStack_1268 = uStack_1278;
        uStack_1190 = local_11a0;
        uStack_1188 = uStack_1198;
        auVar46._16_16_ = *(undefined1 (*) [16])(uVar31 + 0x60 + lVar37);
        auVar46._0_16_ = *(undefined1 (*) [16])(uVar31 + lVar37);
        auVar45 = *(undefined1 (*) [16])(uVar31 + 0x70 + lVar37);
        auVar62._16_16_ = auVar45;
        auVar62._0_16_ = *(undefined1 (*) [16])(uVar31 + 0x10 + lVar37);
        auVar48 = *(undefined1 (*) [16])(uVar31 + 0x80 + lVar37);
        auVar64._16_16_ = auVar48;
        auVar64._0_16_ = *(undefined1 (*) [16])(uVar31 + 0x20 + lVar37);
        auVar56 = *(undefined1 (*) [16])(uVar31 + 0x30 + lVar37);
        auVar49._16_16_ = auVar56;
        auVar49._0_16_ = auVar56;
        auVar56 = *(undefined1 (*) [16])(uVar31 + 0x40 + lVar37);
        auVar58._16_16_ = auVar56;
        auVar58._0_16_ = auVar56;
        auVar56 = *(undefined1 (*) [16])(uVar31 + 0x50 + lVar37);
        auVar69._16_16_ = auVar56;
        auVar69._0_16_ = auVar56;
        auVar56 = *(undefined1 (*) [16])(uVar31 + 0x90 + lVar37);
        auVar71._16_16_ = auVar56;
        auVar71._0_16_ = auVar56;
        auVar6 = *(undefined1 (*) [16])(uVar31 + 0xa0 + lVar37);
        auVar74._16_16_ = auVar6;
        auVar74._0_16_ = auVar6;
        auVar6 = *(undefined1 (*) [16])(uVar31 + 0xb0 + lVar37);
        auVar80._16_16_ = auVar6;
        auVar80._0_16_ = auVar6;
        auVar57 = vsubps_avx(auVar46,auVar49);
        auVar85 = vsubps_avx(auVar62,auVar58);
        auVar8 = vsubps_avx(auVar64,auVar69);
        auVar49 = vsubps_avx(auVar71,auVar46);
        auVar9 = vsubps_avx(auVar74,auVar62);
        auVar10 = vsubps_avx(auVar80,auVar64);
        auVar11._4_4_ = auVar85._4_4_ * auVar10._4_4_;
        auVar11._0_4_ = auVar85._0_4_ * auVar10._0_4_;
        auVar11._8_4_ = auVar85._8_4_ * auVar10._8_4_;
        auVar11._12_4_ = auVar85._12_4_ * auVar10._12_4_;
        auVar11._16_4_ = auVar85._16_4_ * auVar10._16_4_;
        auVar11._20_4_ = auVar85._20_4_ * auVar10._20_4_;
        auVar11._24_4_ = auVar85._24_4_ * auVar10._24_4_;
        auVar11._28_4_ = auVar6._12_4_;
        auVar6 = vfmsub231ps_fma(auVar11,auVar9,auVar8);
        auVar12._4_4_ = auVar49._4_4_ * auVar8._4_4_;
        auVar12._0_4_ = auVar49._0_4_ * auVar8._0_4_;
        auVar12._8_4_ = auVar49._8_4_ * auVar8._8_4_;
        auVar12._12_4_ = auVar49._12_4_ * auVar8._12_4_;
        auVar12._16_4_ = auVar49._16_4_ * auVar8._16_4_;
        auVar12._20_4_ = auVar49._20_4_ * auVar8._20_4_;
        auVar12._24_4_ = auVar49._24_4_ * auVar8._24_4_;
        auVar12._28_4_ = auVar56._12_4_;
        auVar61 = vfmsub231ps_fma(auVar12,auVar10,auVar57);
        auVar13._4_4_ = uVar33;
        auVar13._0_4_ = uVar33;
        auVar13._8_4_ = uVar33;
        auVar13._12_4_ = uVar33;
        auVar13._16_4_ = uVar33;
        auVar13._20_4_ = uVar33;
        auVar13._24_4_ = uVar33;
        auVar13._28_4_ = uVar33;
        auVar11 = vsubps_avx(auVar46,auVar13);
        auVar25._4_4_ = uVar2;
        auVar25._0_4_ = uVar2;
        auVar25._8_4_ = uVar2;
        auVar25._12_4_ = uVar2;
        auVar25._16_4_ = uVar2;
        auVar25._20_4_ = uVar2;
        auVar25._24_4_ = uVar2;
        auVar25._28_4_ = uVar2;
        auVar12 = vsubps_avx(auVar62,auVar25);
        auVar26._4_4_ = uVar3;
        auVar26._0_4_ = uVar3;
        auVar26._8_4_ = uVar3;
        auVar26._12_4_ = uVar3;
        auVar26._16_4_ = uVar3;
        auVar26._20_4_ = uVar3;
        auVar26._24_4_ = uVar3;
        auVar26._28_4_ = uVar3;
        auVar13 = vsubps_avx(auVar64,auVar26);
        auVar29._4_4_ = fStack_11bc;
        auVar29._0_4_ = local_11c0;
        auVar29._8_4_ = fStack_11b8;
        auVar29._12_4_ = fStack_11b4;
        auVar29._16_4_ = fStack_11b0;
        auVar29._20_4_ = fStack_11ac;
        auVar29._24_4_ = fStack_11a8;
        auVar29._28_4_ = fStack_11a4;
        auVar17._4_4_ = fStack_11bc * auVar12._4_4_;
        auVar17._0_4_ = local_11c0 * auVar12._0_4_;
        auVar17._8_4_ = fStack_11b8 * auVar12._8_4_;
        auVar17._12_4_ = fStack_11b4 * auVar12._12_4_;
        auVar17._16_4_ = fStack_11b0 * auVar12._16_4_;
        auVar17._20_4_ = fStack_11ac * auVar12._20_4_;
        auVar17._24_4_ = fStack_11a8 * auVar12._24_4_;
        auVar17._28_4_ = auVar45._12_4_;
        auVar28._4_4_ = fStack_11dc;
        auVar28._0_4_ = local_11e0;
        auVar28._8_4_ = fStack_11d8;
        auVar28._12_4_ = fStack_11d4;
        auVar28._16_4_ = fStack_11d0;
        auVar28._20_4_ = fStack_11cc;
        auVar28._24_4_ = fStack_11c8;
        auVar28._28_4_ = fStack_11c4;
        auVar45 = vfmsub231ps_fma(auVar17,auVar11,auVar28);
        auVar18._4_4_ = auVar10._4_4_ * auVar45._4_4_;
        auVar18._0_4_ = auVar10._0_4_ * auVar45._0_4_;
        auVar18._8_4_ = auVar10._8_4_ * auVar45._8_4_;
        auVar18._12_4_ = auVar10._12_4_ * auVar45._12_4_;
        auVar18._16_4_ = auVar10._16_4_ * 0.0;
        auVar18._20_4_ = auVar10._20_4_ * 0.0;
        auVar18._24_4_ = auVar10._24_4_ * 0.0;
        auVar18._28_4_ = auVar48._12_4_;
        auVar63._0_4_ = auVar8._0_4_ * auVar45._0_4_;
        auVar63._4_4_ = auVar8._4_4_ * auVar45._4_4_;
        auVar63._8_4_ = auVar8._8_4_ * auVar45._8_4_;
        auVar63._12_4_ = auVar8._12_4_ * auVar45._12_4_;
        auVar63._16_4_ = auVar8._16_4_ * 0.0;
        auVar63._20_4_ = auVar8._20_4_ * 0.0;
        auVar63._24_4_ = auVar8._24_4_ * 0.0;
        auVar63._28_4_ = 0;
        auVar27._4_4_ = fStack_11fc;
        auVar27._0_4_ = local_1200;
        auVar27._8_4_ = fStack_11f8;
        auVar27._12_4_ = fStack_11f4;
        auVar27._16_4_ = fStack_11f0;
        auVar27._20_4_ = fStack_11ec;
        auVar27._24_4_ = fStack_11e8;
        auVar27._28_4_ = fStack_11e4;
        auVar19._4_4_ = fStack_11fc * auVar11._4_4_;
        auVar19._0_4_ = local_1200 * auVar11._0_4_;
        auVar19._8_4_ = fStack_11f8 * auVar11._8_4_;
        auVar19._12_4_ = fStack_11f4 * auVar11._12_4_;
        auVar19._16_4_ = fStack_11f0 * auVar11._16_4_;
        auVar19._20_4_ = fStack_11ec * auVar11._20_4_;
        auVar19._24_4_ = fStack_11e8 * auVar11._24_4_;
        auVar19._28_4_ = auVar8._28_4_;
        auVar48 = vfmsub231ps_fma(auVar19,auVar13,auVar29);
        auVar45 = vfmadd231ps_fma(auVar18,ZEXT1632(auVar48),auVar9);
        auVar8._4_4_ = auVar9._4_4_ * auVar57._4_4_;
        auVar8._0_4_ = auVar9._0_4_ * auVar57._0_4_;
        auVar8._8_4_ = auVar9._8_4_ * auVar57._8_4_;
        auVar8._12_4_ = auVar9._12_4_ * auVar57._12_4_;
        auVar8._16_4_ = auVar9._16_4_ * auVar57._16_4_;
        auVar8._20_4_ = auVar9._20_4_ * auVar57._20_4_;
        auVar8._24_4_ = auVar9._24_4_ * auVar57._24_4_;
        auVar8._28_4_ = auVar9._28_4_;
        auVar15 = vfmsub231ps_fma(auVar8,auVar49,auVar85);
        auVar48 = vfmadd231ps_fma(auVar63,auVar85,ZEXT1632(auVar48));
        auVar9._4_4_ = fStack_11dc * auVar13._4_4_;
        auVar9._0_4_ = local_11e0 * auVar13._0_4_;
        auVar9._8_4_ = fStack_11d8 * auVar13._8_4_;
        auVar9._12_4_ = fStack_11d4 * auVar13._12_4_;
        auVar9._16_4_ = fStack_11d0 * auVar13._16_4_;
        auVar9._20_4_ = fStack_11cc * auVar13._20_4_;
        auVar9._24_4_ = fStack_11c8 * auVar13._24_4_;
        auVar9._28_4_ = auVar10._28_4_;
        auVar16 = vfmsub231ps_fma(auVar9,auVar12,auVar27);
        fVar72 = auVar15._0_4_;
        fVar75 = auVar15._4_4_;
        auVar10._4_4_ = fVar75 * fStack_11fc;
        auVar10._0_4_ = fVar72 * local_1200;
        fVar76 = auVar15._8_4_;
        auVar10._8_4_ = fVar76 * fStack_11f8;
        fVar77 = auVar15._12_4_;
        auVar10._12_4_ = fVar77 * fStack_11f4;
        auVar10._16_4_ = fStack_11f0 * 0.0;
        auVar10._20_4_ = fStack_11ec * 0.0;
        auVar10._24_4_ = fStack_11e8 * 0.0;
        auVar10._28_4_ = fStack_11e4;
        auVar56 = vfmadd231ps_fma(auVar10,ZEXT1632(auVar61),auVar28);
        auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),ZEXT1632(auVar16),auVar49);
        auVar59._8_4_ = 0x80000000;
        auVar59._0_8_ = 0x8000000080000000;
        auVar59._12_4_ = 0x80000000;
        auVar59._16_4_ = 0x80000000;
        auVar59._20_4_ = 0x80000000;
        auVar59._24_4_ = 0x80000000;
        auVar59._28_4_ = 0x80000000;
        auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar6),auVar29);
        auVar85 = vandps_avx(ZEXT1632(auVar56),auVar59);
        uVar55 = auVar85._0_4_;
        auVar83._0_4_ = (float)(uVar55 ^ auVar45._0_4_);
        uVar34 = auVar85._4_4_;
        auVar83._4_4_ = (float)(uVar34 ^ auVar45._4_4_);
        uVar35 = auVar85._8_4_;
        auVar83._8_4_ = (float)(uVar35 ^ auVar45._8_4_);
        uVar60 = auVar85._12_4_;
        auVar83._12_4_ = (float)(uVar60 ^ auVar45._12_4_);
        local_1140._16_4_ = auVar85._16_4_;
        auVar83._16_4_ = local_1140._16_4_;
        local_1140._20_4_ = auVar85._20_4_;
        auVar83._20_4_ = local_1140._20_4_;
        local_1140._24_4_ = auVar85._24_4_;
        auVar83._24_4_ = local_1140._24_4_;
        local_1140._28_4_ = auVar85._28_4_;
        auVar83._28_4_ = local_1140._28_4_;
        auVar45 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar57,ZEXT1632(auVar16));
        local_1160._0_4_ = (float)(uVar55 ^ auVar45._0_4_);
        local_1160._4_4_ = (float)(uVar34 ^ auVar45._4_4_);
        local_1160._8_4_ = (float)(uVar35 ^ auVar45._8_4_);
        local_1160._12_4_ = (float)(uVar60 ^ auVar45._12_4_);
        local_1160._16_4_ = local_1140._16_4_;
        local_1160._20_4_ = local_1140._20_4_;
        local_1160._24_4_ = local_1140._24_4_;
        local_1160._28_4_ = local_1140._28_4_;
        auVar85 = vcmpps_avx(auVar83,ZEXT832(0) << 0x20,5);
        auVar57 = vcmpps_avx(local_1160,ZEXT832(0) << 0x20,5);
        auVar85 = vandps_avx(auVar85,auVar57);
        auVar50._8_4_ = 0x7fffffff;
        auVar50._0_8_ = 0x7fffffff7fffffff;
        auVar50._12_4_ = 0x7fffffff;
        auVar50._16_4_ = 0x7fffffff;
        auVar50._20_4_ = 0x7fffffff;
        auVar50._24_4_ = 0x7fffffff;
        auVar50._28_4_ = 0x7fffffff;
        local_1120 = vandps_avx(ZEXT1632(auVar56),auVar50);
        auVar57 = vcmpps_avx(ZEXT1632(auVar56),ZEXT832(0) << 0x20,4);
        auVar85 = vandps_avx(auVar85,auVar57);
        auVar65._0_4_ = auVar83._0_4_ + local_1160._0_4_;
        auVar65._4_4_ = auVar83._4_4_ + local_1160._4_4_;
        auVar65._8_4_ = auVar83._8_4_ + local_1160._8_4_;
        auVar65._12_4_ = auVar83._12_4_ + local_1160._12_4_;
        auVar65._16_4_ = local_1140._16_4_ + local_1140._16_4_;
        auVar65._20_4_ = local_1140._20_4_ + local_1140._20_4_;
        auVar65._24_4_ = local_1140._24_4_ + local_1140._24_4_;
        auVar65._28_4_ = local_1140._28_4_ + local_1140._28_4_;
        auVar57 = vcmpps_avx(auVar65,local_1120,2);
        auVar8 = auVar57 & auVar85;
        if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar8 >> 0x7f,0) != '\0') ||
              (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0xbf,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar8[0x1f] < '\0') {
          auVar85 = vandps_avx(auVar85,auVar57);
          auVar45 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
          auVar20._4_4_ = fVar75 * auVar13._4_4_;
          auVar20._0_4_ = fVar72 * auVar13._0_4_;
          auVar20._8_4_ = fVar76 * auVar13._8_4_;
          auVar20._12_4_ = fVar77 * auVar13._12_4_;
          auVar20._16_4_ = auVar13._16_4_ * 0.0;
          auVar20._20_4_ = auVar13._20_4_ * 0.0;
          auVar20._24_4_ = auVar13._24_4_ * 0.0;
          auVar20._28_4_ = auVar13._28_4_;
          auVar48 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar61),auVar20);
          auVar48 = vfmadd213ps_fma(auVar11,ZEXT1632(auVar6),ZEXT1632(auVar48));
          local_1140._0_4_ = (float)(uVar55 ^ auVar48._0_4_);
          local_1140._4_4_ = (float)(uVar34 ^ auVar48._4_4_);
          local_1140._8_4_ = (float)(uVar35 ^ auVar48._8_4_);
          local_1140._12_4_ = (float)(uVar60 ^ auVar48._12_4_);
          fVar47 = *(float *)(ray + k * 4 + 0x30);
          auVar21._4_4_ = local_1120._4_4_ * fVar47;
          auVar21._0_4_ = local_1120._0_4_ * fVar47;
          auVar21._8_4_ = local_1120._8_4_ * fVar47;
          auVar21._12_4_ = local_1120._12_4_ * fVar47;
          auVar21._16_4_ = local_1120._16_4_ * fVar47;
          auVar21._20_4_ = local_1120._20_4_ * fVar47;
          auVar21._24_4_ = local_1120._24_4_ * fVar47;
          auVar21._28_4_ = fVar47;
          auVar85 = vcmpps_avx(auVar21,local_1140,1);
          fVar47 = *(float *)(ray + k * 4 + 0x80);
          auVar22._4_4_ = local_1120._4_4_ * fVar47;
          auVar22._0_4_ = local_1120._0_4_ * fVar47;
          auVar22._8_4_ = local_1120._8_4_ * fVar47;
          auVar22._12_4_ = local_1120._12_4_ * fVar47;
          auVar22._16_4_ = local_1120._16_4_ * fVar47;
          auVar22._20_4_ = local_1120._20_4_ * fVar47;
          auVar22._24_4_ = local_1120._24_4_ * fVar47;
          auVar22._28_4_ = fVar47;
          auVar57 = vcmpps_avx(local_1140,auVar22,2);
          auVar85 = vandps_avx(auVar85,auVar57);
          auVar48 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
          auVar45 = vpand_avx(auVar48,auVar45);
          auVar85 = vpmovzxwd_avx2(auVar45);
          auVar85 = vpslld_avx2(auVar85,0x1f);
          if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar85 >> 0x7f,0) != '\0') ||
                (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar85 >> 0xbf,0) != '\0') ||
              (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar85[0x1f] < '\0') {
            local_10a0 = vpsrad_avx2(auVar85,0x1f);
            local_1180 = auVar83;
            local_1100 = ZEXT1632(auVar6);
            local_10e0 = ZEXT1632(auVar61);
            local_10c0 = ZEXT1632(auVar15);
            local_fc0 = local_1220;
            local_1260 = local_10a0;
            auVar57 = vrcpps_avx(local_1120);
            auVar66._8_4_ = 0x3f800000;
            auVar66._0_8_ = &DAT_3f8000003f800000;
            auVar66._12_4_ = 0x3f800000;
            auVar66._16_4_ = 0x3f800000;
            auVar66._20_4_ = 0x3f800000;
            auVar66._24_4_ = 0x3f800000;
            auVar66._28_4_ = 0x3f800000;
            auVar48 = vfnmadd213ps_fma(local_1120,auVar57,auVar66);
            auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar57,auVar57);
            fVar47 = auVar48._0_4_;
            fVar52 = auVar48._4_4_;
            auVar23._4_4_ = fVar52 * local_1140._4_4_;
            auVar23._0_4_ = fVar47 * local_1140._0_4_;
            fVar53 = auVar48._8_4_;
            auVar23._8_4_ = fVar53 * local_1140._8_4_;
            fVar54 = auVar48._12_4_;
            auVar23._12_4_ = fVar54 * local_1140._12_4_;
            auVar23._16_4_ = local_1140._16_4_ * 0.0;
            auVar23._20_4_ = local_1140._20_4_ * 0.0;
            auVar23._24_4_ = local_1140._24_4_ * 0.0;
            auVar23._28_4_ = fStack_11c4;
            local_1040 = auVar23;
            auVar24._4_4_ = auVar83._4_4_ * fVar52;
            auVar24._0_4_ = auVar83._0_4_ * fVar47;
            auVar24._8_4_ = auVar83._8_4_ * fVar53;
            auVar24._12_4_ = auVar83._12_4_ * fVar54;
            auVar24._16_4_ = local_1140._16_4_ * 0.0;
            auVar24._20_4_ = local_1140._20_4_ * 0.0;
            auVar24._24_4_ = local_1140._24_4_ * 0.0;
            auVar24._28_4_ = local_1140._28_4_;
            auVar57 = vminps_avx(auVar24,auVar66);
            auVar51._0_4_ = local_1160._0_4_ * fVar47;
            auVar51._4_4_ = local_1160._4_4_ * fVar52;
            auVar51._8_4_ = local_1160._8_4_ * fVar53;
            auVar51._12_4_ = local_1160._12_4_ * fVar54;
            auVar51._16_4_ = local_1140._16_4_ * 0.0;
            auVar51._20_4_ = local_1140._20_4_ * 0.0;
            auVar51._24_4_ = local_1140._24_4_ * 0.0;
            auVar51._28_4_ = 0;
            auVar8 = vminps_avx(auVar51,auVar66);
            auVar49 = vsubps_avx(auVar66,auVar57);
            auVar9 = vsubps_avx(auVar66,auVar8);
            local_1060 = vblendvps_avx(auVar8,auVar49,local_1220);
            local_1080 = vblendvps_avx(auVar57,auVar9,local_1220);
            local_1020[0] = auVar6._0_4_ * (float)local_1240._0_4_;
            local_1020[1] = auVar6._4_4_ * (float)local_1240._4_4_;
            local_1020[2] = auVar6._8_4_ * fStack_1238;
            local_1020[3] = auVar6._12_4_ * fStack_1234;
            fStack_1010 = fStack_1230 * 0.0;
            fStack_100c = fStack_122c * 0.0;
            fStack_1008 = fStack_1228 * 0.0;
            uStack_1004 = local_1080._28_4_;
            local_1000[0] = (float)local_1240._0_4_ * auVar61._0_4_;
            local_1000[1] = (float)local_1240._4_4_ * auVar61._4_4_;
            local_1000[2] = fStack_1238 * auVar61._8_4_;
            local_1000[3] = fStack_1234 * auVar61._12_4_;
            fStack_ff0 = fStack_1230 * 0.0;
            fStack_fec = fStack_122c * 0.0;
            fStack_fe8 = fStack_1228 * 0.0;
            uStack_fe4 = auVar57._28_4_;
            local_fe0[0] = fVar72 * (float)local_1240._0_4_;
            local_fe0[1] = fVar75 * (float)local_1240._4_4_;
            local_fe0[2] = fVar76 * fStack_1238;
            local_fe0[3] = fVar77 * fStack_1234;
            fStack_fd0 = fStack_1230 * 0.0;
            fStack_fcc = fStack_122c * 0.0;
            fStack_fc8 = fStack_1228 * 0.0;
            uStack_fc4 = uStack_1224;
            auVar67._8_4_ = 0x7f800000;
            auVar67._0_8_ = 0x7f8000007f800000;
            auVar67._12_4_ = 0x7f800000;
            auVar67._16_4_ = 0x7f800000;
            auVar67._20_4_ = 0x7f800000;
            auVar67._24_4_ = 0x7f800000;
            auVar67._28_4_ = 0x7f800000;
            auVar85 = vblendvps_avx(auVar67,auVar23,auVar85);
            auVar57 = vshufps_avx(auVar85,auVar85,0xb1);
            auVar57 = vminps_avx(auVar85,auVar57);
            auVar8 = vshufpd_avx(auVar57,auVar57,5);
            auVar57 = vminps_avx(auVar57,auVar8);
            auVar8 = vpermpd_avx2(auVar57,0x4e);
            auVar57 = vminps_avx(auVar57,auVar8);
            auVar85 = vcmpps_avx(auVar85,auVar57,0);
            auVar48 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
            auVar45 = vpand_avx(auVar48,auVar45);
            auVar85 = vpmovzxwd_avx2(auVar45);
            auVar85 = vpslld_avx2(auVar85,0x1f);
            if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar85 >> 0x7f,0) == '\0') &&
                  (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar85 >> 0xbf,0) == '\0') &&
                (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar85[0x1f]) {
              auVar85 = local_10a0;
            }
            uVar34 = vmovmskps_avx(auVar85);
            uVar55 = 0;
            for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x80000000) {
              uVar55 = uVar55 + 1;
            }
            local_1378 = (ulong)uVar55;
            pRVar7 = (context->scene->geometries).items;
            uVar55 = *(uint *)(ray + k * 4 + 0x90);
            local_1370 = (ulong)*(uint *)((long)&local_1280 + local_1378 * 4);
            pGVar38 = pRVar7[local_1370].ptr;
            while ((pGVar38->mask & uVar55) == 0) {
              *(undefined4 *)(local_1260 + local_1378 * 4) = 0;
              if ((((((((local_1260 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1260 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1260 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1260 >> 0x7f,0) == '\0') &&
                    (local_1260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_1260 >> 0xbf,0) == '\0') &&
                  (local_1260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_1260[0x1f]) goto LAB_0057753b;
              auVar85 = vblendvps_avx(auVar67,auVar23,local_1260);
              auVar57 = vshufps_avx(auVar85,auVar85,0xb1);
              auVar57 = vminps_avx(auVar85,auVar57);
              auVar8 = vshufpd_avx(auVar57,auVar57,5);
              auVar57 = vminps_avx(auVar57,auVar8);
              auVar8 = vpermpd_avx2(auVar57,0x4e);
              auVar57 = vminps_avx(auVar57,auVar8);
              auVar57 = vcmpps_avx(auVar85,auVar57,0);
              auVar8 = local_1260 & auVar57;
              auVar85 = local_1260;
              if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar8 >> 0x7f,0) != '\0') ||
                    (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar8 >> 0xbf,0) != '\0') ||
                  (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar8[0x1f] < '\0') {
                auVar85 = vandps_avx(auVar57,local_1260);
              }
              uVar35 = vmovmskps_avx(auVar85);
              uVar34 = 0;
              for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
                uVar34 = uVar34 + 1;
              }
              local_1378 = (ulong)uVar34;
              local_1370 = (ulong)*(uint *)((long)&local_1280 + local_1378 * 4);
              pGVar38 = pRVar7[local_1370].ptr;
            }
            uVar36 = (ulong)(uint)((int)local_1378 << 2);
            uVar4 = *(undefined4 *)(local_1080 + uVar36);
            uVar5 = *(undefined4 *)(local_1060 + uVar36);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1040 + uVar36);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_1020 + uVar36);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_1000 + uVar36);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_fe0 + uVar36);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar4;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
            *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_11a0 + uVar36);
            *(int *)(ray + k * 4 + 0x120) = (int)local_1370;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
        }
LAB_0057753b:
        lVar43 = lVar43 + 1;
      } while (lVar43 != uVar30 - 8);
    }
    uVar33 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar78 = ZEXT1664(CONCAT412(uVar33,CONCAT48(uVar33,CONCAT44(uVar33,uVar33))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }